

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# doctest.h
# Opt level: O1

String * __thiscall
doctest::detail::
stringifyBinaryExpr<boost::iterator_range<burst::detail::join_iterator_impl<__gnu_cxx::__normal_iterator<boost::iterator_range<char_const*>*,std::vector<boost::iterator_range<char_const*>,std::allocator<boost::iterator_range<char_const*>>>>,boost::iterators::random_access_traversal_tag>>,std::__cxx11::string>
          (String *__return_storage_ptr__,detail *this,
          iterator_range<burst::detail::join_iterator_impl<__gnu_cxx::__normal_iterator<boost::iterator_range<const_char_*>_*,_std::vector<boost::iterator_range<const_char_*>,_std::allocator<boost::iterator_range<const_char_*>_>_>_>,_boost::iterators::random_access_traversal_tag>_>
          *lhs,char *op,basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *rhs)

{
  ostream *stream;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in;
  String local_80;
  String local_68;
  String local_50;
  String local_38;
  
  stream = tlssPush();
  filldata<boost::iterator_range<burst::detail::join_iterator_impl<__gnu_cxx::__normal_iterator<boost::iterator_range<const_char_*>_*,_std::vector<boost::iterator_range<const_char_*>,_std::allocator<boost::iterator_range<const_char_*>_>_>_>,_boost::iterators::random_access_traversal_tag>_>_>
  ::fill(stream,(iterator_range<burst::detail::join_iterator_impl<__gnu_cxx::__normal_iterator<boost::iterator_range<const_char_*>_*,_std::vector<boost::iterator_range<const_char_*>,_std::allocator<boost::iterator_range<const_char_*>_>_>_>,_boost::iterators::random_access_traversal_tag>_>
                 *)this);
  tlssPop();
  String::String(&local_68,(char *)lhs);
  operator+(&local_38,&local_50,&local_68);
  toStream<std::__cxx11::string>(&local_80,(detail *)op,in);
  operator+(__return_storage_ptr__,&local_38,&local_80);
  String::~String(&local_80);
  String::~String(&local_38);
  String::~String(&local_68);
  String::~String(&local_50);
  return __return_storage_ptr__;
}

Assistant:

String stringifyBinaryExpr(const DOCTEST_REF_WRAP(L) lhs, const char* op,
                               const DOCTEST_REF_WRAP(R) rhs) {
        return (DOCTEST_STRINGIFY(lhs)) + op + (DOCTEST_STRINGIFY(rhs));
    }